

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::GBheadVisitor::~GBheadVisitor(GBheadVisitor *this)

{
  ReplacementVisitor::~ReplacementVisitor(&this->super_ReplacementVisitor);
  operator_delete(this,0x78);
  return;
}

Assistant:

GBheadVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "GBheadVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("GBhead");

      // this is the reference structure we'll use for the replacement:
      addSite("N", Vector3d(0.0, 0.0, 3.5));
      addSite("C", Vector3d(0.0, 0.0, 0.0));
      addSite("P", Vector3d(0.0, 0.0, -3.5));
    }